

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<Qt::Key>::emplace<Qt::Key&>
          (QPodArrayOps<Qt::Key> *this,qsizetype i,Key *args)

{
  qsizetype *pqVar1;
  Key KVar2;
  Data *pDVar3;
  long lVar4;
  qsizetype qVar5;
  Key *pKVar6;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<Qt::Key>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<Qt::Key>).size == i) &&
       (qVar5 = QArrayDataPointer<Qt::Key>::freeSpaceAtEnd(&this->super_QArrayDataPointer<Qt::Key>),
       qVar5 != 0)) {
      lVar4 = (this->super_QArrayDataPointer<Qt::Key>).size;
      (this->super_QArrayDataPointer<Qt::Key>).ptr[lVar4] = *args;
      (this->super_QArrayDataPointer<Qt::Key>).size = lVar4 + 1;
      return;
    }
    if ((i == 0) &&
       (qVar5 = QArrayDataPointer<Qt::Key>::freeSpaceAtBegin
                          (&this->super_QArrayDataPointer<Qt::Key>), qVar5 != 0)) {
      pKVar6 = (this->super_QArrayDataPointer<Qt::Key>).ptr;
      pKVar6[-1] = *args;
      (this->super_QArrayDataPointer<Qt::Key>).ptr = pKVar6 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<Qt::Key>).size;
      *pqVar1 = *pqVar1 + 1;
      return;
    }
  }
  KVar2 = *args;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<Qt::Key>).size != 0);
  QArrayDataPointer<Qt::Key>::detachAndGrow
            (&this->super_QArrayDataPointer<Qt::Key>,where,1,(Key **)0x0,
             (QArrayDataPointer<Qt::Key> *)0x0);
  pKVar6 = createHole(this,where,i,1);
  *pKVar6 = KVar2;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }